

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_file.cc
# Opt level: O1

int X509_load_cert_crl_file(X509_LOOKUP *ctx,char *file,int type)

{
  int iVar1;
  BIO *bp;
  OPENSSL_STACK *sk;
  size_t sVar2;
  undefined8 *puVar3;
  size_t sVar4;
  int iVar5;
  
  if (type != 1) {
    iVar5 = X509_load_cert_file(ctx,file,type);
    return iVar5;
  }
  bp = BIO_new_file(file,"rb");
  if (bp == (BIO *)0x0) {
    iVar5 = 2;
    iVar1 = 0xbf;
  }
  else {
    iVar5 = 0;
    sk = (OPENSSL_STACK *)
         PEM_X509_INFO_read_bio(bp,(stack_st_X509_INFO *)0x0,(undefined1 *)0x0,(void *)0x0);
    BIO_free(bp);
    if (sk != (OPENSSL_STACK *)0x0) {
      sVar2 = OPENSSL_sk_num(sk);
      if (sVar2 != 0) {
        iVar5 = 0;
        sVar2 = 0;
        do {
          puVar3 = (undefined8 *)OPENSSL_sk_value(sk,sVar2);
          if ((X509 *)*puVar3 != (X509 *)0x0) {
            iVar1 = X509_STORE_add_cert((X509_STORE *)ctx->method_data,(X509 *)*puVar3);
            if (iVar1 == 0) goto LAB_0023b636;
            iVar5 = iVar5 + 1;
          }
          if ((X509_CRL *)puVar3[1] != (X509_CRL *)0x0) {
            iVar1 = X509_STORE_add_crl((X509_STORE *)ctx->method_data,(X509_CRL *)puVar3[1]);
            if (iVar1 == 0) goto LAB_0023b636;
            iVar5 = iVar5 + 1;
          }
          sVar2 = sVar2 + 1;
          sVar4 = OPENSSL_sk_num(sk);
        } while (sVar2 < sVar4);
      }
      if (iVar5 == 0) {
        iVar5 = 0;
        ERR_put_error(0xb,0,0x8e,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_file.cc"
                      ,0xd9);
      }
LAB_0023b636:
      OPENSSL_sk_pop_free_ex(sk,sk_X509_INFO_call_free_func,X509_INFO_free);
      return iVar5;
    }
    iVar5 = 9;
    iVar1 = 0xc5;
  }
  ERR_put_error(0xb,0,iVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_file.cc"
                ,iVar1);
  return 0;
}

Assistant:

int X509_load_cert_crl_file(X509_LOOKUP *ctx, const char *file, int type) {
  STACK_OF(X509_INFO) *inf;
  X509_INFO *itmp;
  BIO *in;
  size_t i;
  int count = 0;

  if (type != X509_FILETYPE_PEM) {
    return X509_load_cert_file(ctx, file, type);
  }
  in = BIO_new_file(file, "rb");
  if (!in) {
    OPENSSL_PUT_ERROR(X509, ERR_R_SYS_LIB);
    return 0;
  }
  inf = PEM_X509_INFO_read_bio(in, NULL, NULL, NULL);
  BIO_free(in);
  if (!inf) {
    OPENSSL_PUT_ERROR(X509, ERR_R_PEM_LIB);
    return 0;
  }
  for (i = 0; i < sk_X509_INFO_num(inf); i++) {
    itmp = sk_X509_INFO_value(inf, i);
    if (itmp->x509) {
      if (!X509_STORE_add_cert(ctx->store_ctx, itmp->x509)) {
        goto err;
      }
      count++;
    }
    if (itmp->crl) {
      if (!X509_STORE_add_crl(ctx->store_ctx, itmp->crl)) {
        goto err;
      }
      count++;
    }
  }

  if (count == 0) {
    OPENSSL_PUT_ERROR(X509, X509_R_NO_CERTIFICATE_OR_CRL_FOUND);
  }

err:
  sk_X509_INFO_pop_free(inf, X509_INFO_free);
  return count;
}